

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalKdevelopGenerator::CreateFilelistFile
          (cmGlobalKdevelopGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *outputDir,
          string *projectDirIn,string *projectname,string *cmakeFilePattern,string *fileToOpen)

{
  pointer pcVar1;
  cmake *pcVar2;
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  bool bVar3;
  int iVar4;
  long *plVar5;
  char *pcVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  size_type *psVar9;
  long *plVar10;
  pointer pbVar11;
  cmLocalGenerator *pcVar12;
  _Alloc_hider _Var13;
  _Self __tmp;
  pointer ppcVar14;
  pointer ppcVar15;
  string projectDir;
  string tmp;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string filename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ifstream oldFilelist;
  cmGeneratedFileStream fout;
  allocator local_579;
  cmMakefile *local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  string local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_530;
  string local_528;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_508;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_4e8;
  long *local_4e0;
  long local_4d8;
  long local_4d0;
  long lStack_4c8;
  string *local_4c0;
  pointer local_4b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  string local_480;
  byte abStack_460 [488];
  undefined1 local_278 [32];
  uint auStack_258 [138];
  
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  pcVar1 = (projectDirIn->_M_dataplus)._M_p;
  local_4e8 = lgs;
  local_4c0 = cmakeFilePattern;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_570,pcVar1,pcVar1 + projectDirIn->_M_string_length);
  std::__cxx11::string::append((char *)&local_570);
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  pcVar1 = (outputDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_480,pcVar1,pcVar1 + outputDir->_M_string_length);
  std::__cxx11::string::append((char *)&local_480);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_480,(ulong)(projectname->_M_dataplus)._M_p);
  local_278._0_8_ = local_278 + 0x10;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    local_278._16_8_ = *psVar9;
    local_278._24_8_ = plVar5[3];
  }
  else {
    local_278._16_8_ = *psVar9;
    local_278._0_8_ = (size_type *)*plVar5;
  }
  local_278._8_8_ = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_278);
  local_4e0 = &local_4d0;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_4d0 = *plVar10;
    lStack_4c8 = plVar5[3];
  }
  else {
    local_4d0 = *plVar10;
    local_4e0 = (long *)*plVar5;
  }
  local_4d8 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  local_4b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4b0._M_impl.super__Rb_tree_header._M_header;
  local_4b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  local_550._M_string_length = 0;
  local_550.field_2._M_local_buf[0] = '\0';
  ppcVar15 = (local_4e8->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_4b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4b0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppcVar15 !=
      (local_4e8->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar2 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
    do {
      pcVar12 = *ppcVar15;
      local_578 = pcVar12->Makefile;
      pbVar11 = (local_578->ListFiles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar11 !=
          (local_578->ListFiles).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::__cxx11::string::_M_assign((string *)&local_550);
          cmsys::SystemTools::ReplaceString(&local_550,local_570._M_dataplus._M_p,"");
          if ((*local_550._M_dataplus._M_p != '/') &&
             (pcVar6 = strstr(local_550._M_dataplus._M_p,"CMakeFiles/"), pcVar6 == (char *)0x0)) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_4b0,&local_550);
            cmsys::SystemTools::GetFilenameName((string *)local_278,&local_550);
            std::__cxx11::string::operator=((string *)&local_550,(string *)local_278);
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
            }
            iVar4 = std::__cxx11::string::compare((char *)&local_550);
            if (iVar4 != 0) {
              local_530 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_550._M_dataplus._M_p;
              pcVar6 = strstr(local_550._M_dataplus._M_p,".cmake");
              if (pcVar6 == (char *)0x0) {
                local_278._0_8_ = local_278 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_278,local_530,
                           local_550._M_string_length + (long)local_530);
                std::__cxx11::string::append((char *)local_278);
                std::__cxx11::string::_M_append((char *)local_4c0,local_278._0_8_);
                if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                  operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
                }
              }
            }
          }
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 !=
                 (local_578->ListFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        pcVar12 = *ppcVar15;
      }
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_528,
                 &pcVar12->GeneratorTargets);
      _Var13._M_p = local_528._M_dataplus._M_p;
      local_4b8 = ppcVar15;
      if (local_528._M_dataplus._M_p != (pointer)local_528._M_string_length) {
        do {
          local_508.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_508.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_508.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_00 = *(cmGeneratorTarget **)_Var13._M_p;
          this_01 = this_00->Target->Makefile;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          local_530 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var13._M_p;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,"CMAKE_BUILD_TYPE","");
          pcVar6 = cmMakefile::GetSafeDefinition(this_01,&local_480);
          std::__cxx11::string::string((string *)local_278,pcVar6,&local_579);
          cmGeneratorTarget::GetSourceFiles(this_00,&local_508,(string *)local_278);
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          ppcVar14 = local_508.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
            ppcVar14 = local_508.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          }
          for (; ppcVar15 = local_4b8,
              ppcVar14 !=
              local_508.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppcVar14 = ppcVar14 + 1) {
            cmSourceFile::GetFullPath(*ppcVar14,(string *)0x0);
            std::__cxx11::string::_M_assign((string *)&local_550);
            cmsys::SystemTools::GetFilenamePath((string *)local_278,&local_550);
            std::__cxx11::string::append((char *)local_278);
            cmsys::SystemTools::GetFilenameWithoutExtension(&local_480,&local_550);
            std::__cxx11::string::_M_append((char *)local_278,(ulong)local_480._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1
                             );
            }
            cmsys::SystemTools::ReplaceString(&local_550,local_570._M_dataplus._M_p,"");
            if ((*local_550._M_dataplus._M_p != '/') &&
               (pcVar6 = strstr(local_550._M_dataplus._M_p,"CMakeFiles/"), pcVar6 == (char *)0x0)) {
              cmsys::SystemTools::GetFilenameExtension(&local_480,&local_550);
              iVar4 = std::__cxx11::string::compare((char *)&local_480);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_480._M_dataplus._M_p != &local_480.field_2) {
                operator_delete(local_480._M_dataplus._M_p,
                                local_480.field_2._M_allocated_capacity + 1);
              }
              if (iVar4 != 0) {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_4b0,&local_550);
                for (pbVar11 = (pcVar2->HeaderFileExtensions).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    pbVar11 !=
                    (pcVar2->HeaderFileExtensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
                  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_480,local_278._0_8_,
                             (char *)(local_278._0_8_ + local_278._8_8_));
                  std::__cxx11::string::append((char *)&local_480);
                  std::__cxx11::string::_M_append
                            ((char *)&local_480,(ulong)(pbVar11->_M_dataplus)._M_p);
                  bVar3 = cmsys::SystemTools::FileExists(local_480._M_dataplus._M_p);
                  if (bVar3) {
                    cmsys::SystemTools::ReplaceString(&local_480,local_570._M_dataplus._M_p,"");
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_4b0,&local_480);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_480._M_dataplus._M_p != &local_480.field_2) {
                      operator_delete(local_480._M_dataplus._M_p,
                                      local_480.field_2._M_allocated_capacity + 1);
                    }
                    break;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_480._M_dataplus._M_p != &local_480.field_2) {
                    operator_delete(local_480._M_dataplus._M_p,
                                    local_480.field_2._M_allocated_capacity + 1);
                  }
                }
              }
            }
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
            }
          }
          pbVar11 = (local_578->ListFiles).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pbVar11 !=
              (local_578->ListFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              std::__cxx11::string::_M_assign((string *)&local_550);
              cmsys::SystemTools::ReplaceString(&local_550,local_570._M_dataplus._M_p,"");
              if ((*local_550._M_dataplus._M_p != '/') &&
                 (pcVar6 = strstr(local_550._M_dataplus._M_p,"CMakeFiles/"), pcVar6 == (char *)0x0))
              {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_4b0,&local_550);
              }
              pbVar11 = pbVar11 + 1;
            } while (pbVar11 !=
                     (local_578->ListFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          if (local_508.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_508.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_508.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_508.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          _Var13._M_p = (pointer)(&local_530->_M_allocated_capacity + 1);
        } while (_Var13._M_p != (pointer)local_528._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_528._M_dataplus._M_p,
                        local_528.field_2._M_allocated_capacity - (long)local_528._M_dataplus._M_p);
      }
      ppcVar15 = ppcVar15 + 1;
    } while (ppcVar15 !=
             (local_4e8->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::ifstream::ifstream(&local_480,(char *)local_4e0,_S_in);
  if ((abStack_460[*(long *)(local_480._M_dataplus._M_p + -0x18)] & 5) == 0) {
    while (bVar3 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_480,&local_550,(bool *)0x0,-1), bVar3) {
      if (*local_550._M_dataplus._M_p != '/') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,&local_570,&local_550);
        bVar3 = cmsys::SystemTools::FileExists((char *)local_278._0_8_);
        if (bVar3) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_4b0,&local_550);
        }
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
      }
    }
    std::ifstream::close();
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(char *)local_4e0,false,None);
  local_578 = (cmMakefile *)
              CONCAT44(local_578._4_4_,
                       *(uint *)((long)auStack_258 + *(long *)(local_278._0_8_ + -0x18)));
  if (((*(uint *)((long)auStack_258 + *(long *)(local_278._0_8_ + -0x18)) & 5) == 0) &&
     (std::__cxx11::string::_M_replace
                ((ulong)fileToOpen,0,(char *)fileToOpen->_M_string_length,0x58950a),
     (_Rb_tree_header *)local_4b0._M_impl.super__Rb_tree_header._M_header._M_left !=
     &local_4b0._M_impl.super__Rb_tree_header)) {
    p_Var8 = local_4b0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      cmsys::SystemTools::CollapseFullPath
                (&local_528,(string *)(p_Var8 + 1),local_570._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)&local_550,(string *)&local_528);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_dataplus._M_p != &local_528.field_2) {
        operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
      }
      if (fileToOpen->_M_string_length == 0) {
        cmsys::SystemTools::GetFilenameExtension(&local_528,&local_550);
        iVar4 = std::__cxx11::string::compare((char *)&local_528);
        if (((((iVar4 == 0) ||
              (iVar4 = std::__cxx11::string::compare((char *)&local_528), iVar4 == 0)) ||
             (iVar4 = std::__cxx11::string::compare((char *)&local_528), iVar4 == 0)) ||
            ((iVar4 = std::__cxx11::string::compare((char *)&local_528), iVar4 == 0 ||
             (iVar4 = std::__cxx11::string::compare((char *)&local_528), iVar4 == 0)))) ||
           ((iVar4 = std::__cxx11::string::compare((char *)&local_528), iVar4 == 0 ||
            (iVar4 = std::__cxx11::string::compare((char *)&local_528), iVar4 == 0)))) {
          std::__cxx11::string::_M_assign((string *)fileToOpen);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
      }
      cmsys::SystemTools::ReplaceString(&local_550,local_570._M_dataplus._M_p,"");
      if ((local_550._M_string_length != 0) && (*local_550._M_dataplus._M_p != '/')) {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_278,local_550._M_dataplus._M_p,
                            local_550._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &local_4b0._M_impl.super__Rb_tree_header);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  std::ifstream::~ifstream(&local_480);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,
                    CONCAT71(local_550.field_2._M_allocated_capacity._1_7_,
                             local_550.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_4b0);
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0,local_4d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  return ((ulong)local_578 & 5) == 0;
}

Assistant:

bool cmGlobalKdevelopGenerator::CreateFilelistFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& outputDir,
  const std::string& projectDirIn, const std::string& projectname,
  std::string& cmakeFilePattern, std::string& fileToOpen)
{
  std::string projectDir = projectDirIn + "/";
  std::string filename = outputDir + "/" + projectname + ".kdevelop.filelist";

  std::set<std::string> files;
  std::string tmp;

  std::vector<std::string> const& hdrExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  for (std::vector<cmLocalGenerator*>::const_iterator it = lgs.begin();
       it != lgs.end(); it++) {
    cmMakefile* makefile = (*it)->GetMakefile();
    const std::vector<std::string>& listFiles = makefile->GetListFiles();
    for (std::vector<std::string>::const_iterator lt = listFiles.begin();
         lt != listFiles.end(); lt++) {
      tmp = *lt;
      cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
      // make sure the file is part of this source tree
      if ((tmp[0] != '/') &&
          (strstr(tmp.c_str(), cmake::GetCMakeFilesDirectoryPostSlash()) ==
           CM_NULLPTR)) {
        files.insert(tmp);
        tmp = cmSystemTools::GetFilenameName(tmp);
        // add all files which dont match the default
        // */CMakeLists.txt;*cmake; to the file pattern
        if ((tmp != "CMakeLists.txt") &&
            (strstr(tmp.c_str(), ".cmake") == CM_NULLPTR)) {
          cmakeFilePattern += tmp + ";";
        }
      }
    }

    // get all sources
    std::vector<cmGeneratorTarget*> targets = (*it)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++) {
      std::vector<cmSourceFile*> sources;
      cmGeneratorTarget* gt = *ti;
      gt->GetSourceFiles(sources, gt->Target->GetMakefile()->GetSafeDefinition(
                                    "CMAKE_BUILD_TYPE"));
      for (std::vector<cmSourceFile*>::const_iterator si = sources.begin();
           si != sources.end(); si++) {
        tmp = (*si)->GetFullPath();
        std::string headerBasename = cmSystemTools::GetFilenamePath(tmp);
        headerBasename += "/";
        headerBasename += cmSystemTools::GetFilenameWithoutExtension(tmp);

        cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");

        if ((tmp[0] != '/') &&
            (strstr(tmp.c_str(), cmake::GetCMakeFilesDirectoryPostSlash()) ==
             CM_NULLPTR) &&
            (cmSystemTools::GetFilenameExtension(tmp) != ".moc")) {
          files.insert(tmp);

          // check if there's a matching header around
          for (std::vector<std::string>::const_iterator ext = hdrExts.begin();
               ext != hdrExts.end(); ++ext) {
            std::string hname = headerBasename;
            hname += ".";
            hname += *ext;
            if (cmSystemTools::FileExists(hname.c_str())) {
              cmSystemTools::ReplaceString(hname, projectDir.c_str(), "");
              files.insert(hname);
              break;
            }
          }
        }
      }
      for (std::vector<std::string>::const_iterator lt = listFiles.begin();
           lt != listFiles.end(); lt++) {
        tmp = *lt;
        cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
        if ((tmp[0] != '/') &&
            (strstr(tmp.c_str(), cmake::GetCMakeFilesDirectoryPostSlash()) ==
             CM_NULLPTR)) {
          files.insert(tmp);
        }
      }
    }
  }

  // check if the output file already exists and read it
  // insert all files which exist into the set of files
  cmsys::ifstream oldFilelist(filename.c_str());
  if (oldFilelist) {
    while (cmSystemTools::GetLineFromStream(oldFilelist, tmp)) {
      if (tmp[0] == '/') {
        continue;
      }
      std::string completePath = projectDir + tmp;
      if (cmSystemTools::FileExists(completePath.c_str())) {
        files.insert(tmp);
      }
    }
    oldFilelist.close();
  }

  // now write the new filename
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return false;
  }

  fileToOpen = "";
  for (std::set<std::string>::const_iterator it = files.begin();
       it != files.end(); it++) {
    // get the full path to the file
    tmp = cmSystemTools::CollapseFullPath(*it, projectDir.c_str());
    // just select the first source file
    if (fileToOpen.empty()) {
      std::string ext = cmSystemTools::GetFilenameExtension(tmp);
      if ((ext == ".c") || (ext == ".cc") || (ext == ".cpp") ||
          (ext == ".cxx") || (ext == ".C") || (ext == ".h") ||
          (ext == ".hpp")) {
        fileToOpen = tmp;
      }
    }
    // make it relative to the project dir
    cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
    // only put relative paths
    if (!tmp.empty() && tmp[0] != '/') {
      fout << tmp << "\n";
    }
  }
  return true;
}